

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::DuplicateOrdinalDetector::check
          (DuplicateOrdinalDetector *this,Reader ordinal)

{
  ErrorReporter *pEVar1;
  undefined8 uVar2;
  Maybe<capnp::compiler::LocatedInteger::Reader> *pMVar3;
  uint uVar4;
  uint uVar5;
  char (*in_R8) [46];
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  Array<char> local_40;
  char local_28 [8];
  
  if (ordinal._reader.dataSize < 0x40) {
    if (this->expectedOrdinal != 0) {
LAB_0034b9cc:
      message.content.size_ = 0x1a;
      message.content.ptr = "Duplicate ordinal number.";
      ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader&>
                (this->errorReporter,&ordinal,message);
      if ((this->lastOrdinalLocation).ptr.isSet != true) {
        return;
      }
      if (*(uint *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x20) < 0x40) {
        local_28[0] = '\0';
        local_28[1] = '\0';
        local_28[2] = '\0';
        local_28[3] = '\0';
        local_28[4] = '\0';
        local_28[5] = '\0';
        local_28[6] = '\0';
        local_28[7] = '\0';
      }
      else {
        local_28 = *(this->lastOrdinalLocation).ptr.field_1.value._reader.data;
      }
      pEVar1 = this->errorReporter;
      kj::str<char_const(&)[10],unsigned_long,char_const(&)[23]>
                ((String *)&local_40,(kj *)"Ordinal @",(char (*) [10])local_28,
                 (unsigned_long *)" originally used here.",(char (*) [23])in_R8);
      if (local_40.size_ == 0) {
        local_40.ptr = "";
      }
      message_00.content.size_ = local_40.size_ + (local_40.size_ == 0);
      message_00.content.ptr = local_40.ptr;
      ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader&>
                (pEVar1,&(this->lastOrdinalLocation).ptr.field_1.value,message_00);
      kj::Array<char>::~Array(&local_40);
      if ((this->lastOrdinalLocation).ptr.isSet != true) {
        return;
      }
      (this->lastOrdinalLocation).ptr.isSet = false;
      return;
    }
    uVar4 = 0;
  }
  else {
    uVar4 = this->expectedOrdinal;
    if (*ordinal._reader.data < (ulong)uVar4) goto LAB_0034b9cc;
    if ((ulong)uVar4 < *ordinal._reader.data) {
      pEVar1 = this->errorReporter;
      kj::str<char_const(&)[18],unsigned_int&,char_const(&)[46]>
                ((String *)&local_40,(kj *)"Skipped ordinal @",(char (*) [18])&this->expectedOrdinal
                 ,(uint *)".  Ordinals must be sequential with no holes.",in_R8);
      if (local_40.size_ == 0) {
        local_40.ptr = "";
      }
      message_01.content.size_ = local_40.size_ + (local_40.size_ == 0);
      message_01.content.ptr = local_40.ptr;
      ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader&>
                (pEVar1,&ordinal,message_01);
      kj::Array<char>::~Array(&local_40);
      if (ordinal._reader.dataSize < 0x40) {
        uVar5 = 1;
      }
      else {
        uVar5 = *ordinal._reader.data + 1;
      }
      this->expectedOrdinal = uVar5;
      return;
    }
  }
  this->expectedOrdinal = uVar4 + 1;
  if ((this->lastOrdinalLocation).ptr.isSet == true) {
    (this->lastOrdinalLocation).ptr.isSet = false;
  }
  uVar2 = ordinal._reader._32_8_;
  pMVar3 = &this->lastOrdinalLocation;
  *(int *)((long)&(pMVar3->ptr).field_1 + 0x20) = (int)uVar2;
  *(short *)((long)&(pMVar3->ptr).field_1 + 0x24) = (short)((ulong)uVar2 >> 0x20);
  *(short *)((long)&(pMVar3->ptr).field_1 + 0x26) = (short)((ulong)uVar2 >> 0x30);
  *(int *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x28) = ordinal._reader.nestingLimit;
  *(undefined4 *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x2c) = ordinal._reader._44_4_;
  (this->lastOrdinalLocation).ptr.field_1.value._reader.data = ordinal._reader.data;
  (this->lastOrdinalLocation).ptr.field_1.value._reader.pointers = ordinal._reader.pointers;
  (this->lastOrdinalLocation).ptr.field_1.value._reader.segment = ordinal._reader.segment;
  (this->lastOrdinalLocation).ptr.field_1.value._reader.capTable = ordinal._reader.capTable;
  (this->lastOrdinalLocation).ptr.isSet = true;
  return;
}

Assistant:

void check(LocatedInteger::Reader ordinal) {
    if (ordinal.getValue() < expectedOrdinal) {
      errorReporter.addErrorOn(ordinal, "Duplicate ordinal number.");
      KJ_IF_SOME(last, lastOrdinalLocation) {
        errorReporter.addErrorOn(
            last, kj::str("Ordinal @", last.getValue(), " originally used here."));
        // Don't report original again.
        lastOrdinalLocation = kj::none;
      }
    } else if (ordinal.getValue() > expectedOrdinal) {
      errorReporter.addErrorOn(ordinal,
          kj::str("Skipped ordinal @", expectedOrdinal, ".  Ordinals must be sequential with no "
                  "holes."));
      expectedOrdinal = ordinal.getValue() + 1;
    } else {
      ++expectedOrdinal;
      lastOrdinalLocation = ordinal;
    }
  }